

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CropLayerParams::Clear(CropLayerParams *this)

{
  Arena *pAVar1;
  CropLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->offset_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->cropamounts_ != (BorderAmounts *)0x0)) &&
     (this->cropamounts_ != (BorderAmounts *)0x0)) {
    (*(this->cropamounts_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->cropamounts_ = (BorderAmounts *)0x0;
  return;
}

Assistant:

void CropLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CropLayerParams)
  offset_.Clear();
  if (GetArenaNoVirtual() == NULL && cropamounts_ != NULL) {
    delete cropamounts_;
  }
  cropamounts_ = NULL;
}